

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btAlignedObjectArray.h
# Opt level: O3

void __thiscall
btAlignedObjectArray<float>::copyFromArray
          (btAlignedObjectArray<float> *this,btAlignedObjectArray<float> *otherArray)

{
  uint uVar1;
  float *pfVar2;
  uint uVar3;
  float *pfVar4;
  ulong uVar5;
  long lVar6;
  
  uVar1 = otherArray->m_size;
  uVar3 = this->m_size;
  if ((int)uVar1 <= (int)uVar3) {
    pfVar4 = this->m_data;
    goto LAB_001d0e9e;
  }
  lVar6 = (long)(int)uVar3;
  if (this->m_capacity < (int)uVar1) {
    if (uVar1 == 0) {
      pfVar4 = (float *)0x0;
    }
    else {
      pfVar4 = (float *)btAlignedAllocInternal((long)(int)uVar1 * 4,0x10);
      uVar3 = this->m_size;
    }
    pfVar2 = this->m_data;
    if ((int)uVar3 < 1) {
      if (pfVar2 != (float *)0x0) goto LAB_001d0e70;
    }
    else {
      uVar5 = 0;
      do {
        pfVar4[uVar5] = pfVar2[uVar5];
        uVar5 = uVar5 + 1;
      } while (uVar3 != uVar5);
LAB_001d0e70:
      if (this->m_ownsMemory == true) {
        btAlignedFreeInternal(pfVar2);
      }
    }
    this->m_ownsMemory = true;
    this->m_data = pfVar4;
    this->m_capacity = uVar1;
  }
  else {
    pfVar4 = this->m_data;
  }
  memset(pfVar4 + lVar6,0,((int)uVar1 - lVar6) * 4);
LAB_001d0e9e:
  this->m_size = uVar1;
  if (0 < (int)uVar1) {
    pfVar2 = otherArray->m_data;
    uVar5 = 0;
    do {
      pfVar4[uVar5] = pfVar2[uVar5];
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  return;
}

Assistant:

void copyFromArray(const btAlignedObjectArray& otherArray)
	{
		int otherSize = otherArray.size();
		resize (otherSize);
		otherArray.copy(0, otherSize, m_data);
	}